

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O3

bool __thiscall cmWorkerPool::Process(cmWorkerPool *this,void *userData)

{
  bool bVar1;
  
  this->UserData_ = userData;
  bVar1 = cmWorkerPoolInternal::Process
                    ((this->Int_)._M_t.
                     super___uniq_ptr_impl<cmWorkerPoolInternal,_std::default_delete<cmWorkerPoolInternal>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmWorkerPoolInternal_*,_std::default_delete<cmWorkerPoolInternal>_>
                     .super__Head_base<0UL,_cmWorkerPoolInternal_*,_false>._M_head_impl);
  this->UserData_ = (void *)0x0;
  return bVar1;
}

Assistant:

bool cmWorkerPool::Process(void* userData)
{
  // Setup user data
  UserData_ = userData;
  // Run libuv loop
  bool success = Int_->Process();
  // Clear user data
  UserData_ = nullptr;
  // Return
  return success;
}